

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O0

FrameEntry * __thiscall
llvm::DWARFDebugFrame::getEntryAtOffset(DWARFDebugFrame *this,uint64_t Offset)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *puVar2;
  pointer this_02;
  bool bVar3;
  __normal_iterator<const_std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_*,_std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>_>
  local_38;
  uint64_t local_30;
  __normal_iterator<const_std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_*,_std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>_>
  local_28;
  const_iterator It;
  uint64_t Offset_local;
  DWARFDebugFrame *this_local;
  
  local_30 = Offset;
  It._M_current =
       (unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *)Offset;
  local_28._M_current =
       (unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *)
       partition_point<std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>,std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>>>const&,llvm::DWARFDebugFrame::getEntryAtOffset(unsigned_long)const::__0,std::unique_ptr<llvm::dwarf::FrameEntry,std::default_delete<llvm::dwarf::FrameEntry>>const&>
                 (&this->Entries,(anon_class_8_1_2dc041f1)Offset);
  local_38._M_current =
       (unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *)
       std::
       vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
       ::end(&this->Entries);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
  bVar3 = false;
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_*,_std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>_>
              ::operator*(&local_28);
    this_01 = std::
              unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>::
              operator->(this_00);
    puVar2 = (unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_> *)
             dwarf::FrameEntry::getOffset(this_01);
    bVar3 = puVar2 == It._M_current;
  }
  if (bVar3) {
    this_02 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_*,_std::vector<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>_>
              ::operator->(&local_28);
    this_local = (DWARFDebugFrame *)
                 std::
                 unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>
                 ::get(this_02);
  }
  else {
    this_local = (DWARFDebugFrame *)0x0;
  }
  return (FrameEntry *)this_local;
}

Assistant:

FrameEntry *DWARFDebugFrame::getEntryAtOffset(uint64_t Offset) const {
  auto It = partition_point(Entries, [=](const std::unique_ptr<FrameEntry> &E) {
    return E->getOffset() < Offset;
  });
  if (It != Entries.end() && (*It)->getOffset() == Offset)
    return It->get();
  return nullptr;
}